

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double * __thiscall ON_4dPoint::operator[](ON_4dPoint *this,int i)

{
  if (0 < i) {
    if (2 < (uint)i) {
      return &this->w;
    }
    this = (ON_4dPoint *)(&this->y + (i != 1));
  }
  return &this->x;
}

Assistant:

double& ON_4dPoint::operator[](int i)
{
  double* pd = (i<=0) ? &x : ( (i>=3) ? &w : (i==1)?&y:&z);
  return *pd;
}